

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZDICT_addEntropyTablesFromBuffer_advanced
                 (void *dictBuffer,size_t dictContentSize,size_t dictBufferCapacity,
                 void *samplesBuffer,size_t *samplesSizes,uint nbSamples,ZDICT_params_t params)

{
  uint uVar1;
  long lVar2;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  size_t len;
  uint in_stack_0000000c;
  U32 dictID;
  U32 compliantID;
  U64 randomID;
  size_t eSize;
  size_t hSize;
  U32 notificationLevel;
  int compressionLevel;
  uint in_stack_000032ac;
  size_t *in_stack_000032b0;
  void *in_stack_000032b8;
  int in_stack_000032c4;
  size_t in_stack_000032c8;
  void *in_stack_000032d0;
  void *in_stack_000032f0;
  size_t in_stack_000032f8;
  uint in_stack_00003300;
  void *memPtr;
  size_t local_78;
  size_t local_8;
  
  if (1 < in_stack_0000000c) {
    fprintf(_stderr,"\r%70s\r","");
    fflush(_stderr);
    fprintf(_stderr,"statistics ... \n");
    fflush(_stderr);
  }
  len = (in_RDI + in_RDX) - (long)in_RSI;
  memPtr = in_RSI;
  local_8 = ZDICT_analyzeEntropy
                      (in_stack_000032d0,in_stack_000032c8,in_stack_000032c4,in_stack_000032b8,
                       in_stack_000032b0,in_stack_000032ac,in_stack_000032f0,in_stack_000032f8,
                       in_stack_00003300);
  uVar1 = ZDICT_isError(0x299524);
  if (uVar1 == 0) {
    lVar2 = local_8 + 8;
    MEM_writeLE32(memPtr,(U32)(len >> 0x20));
    XXH_INLINE_XXH64(memPtr,len,0x299587);
    MEM_writeLE32(memPtr,(U32)(len >> 0x20));
    if ((ulong)(lVar2 + (long)in_RSI) < in_RDX) {
      memmove((void *)(in_RDI + lVar2),(void *)((in_RDI + in_RDX) - (long)in_RSI),(size_t)in_RSI);
    }
    local_78 = in_RDX;
    if ((ulong)(lVar2 + (long)in_RSI) <= in_RDX) {
      local_78 = lVar2 + (long)in_RSI;
    }
    local_8 = local_78;
  }
  return local_8;
}

Assistant:

static size_t ZDICT_addEntropyTablesFromBuffer_advanced(
        void* dictBuffer, size_t dictContentSize, size_t dictBufferCapacity,
        const void* samplesBuffer, const size_t* samplesSizes, unsigned nbSamples,
        ZDICT_params_t params)
{
    int const compressionLevel = (params.compressionLevel == 0) ? ZSTD_CLEVEL_DEFAULT : params.compressionLevel;
    U32 const notificationLevel = params.notificationLevel;
    size_t hSize = 8;

    /* calculate entropy tables */
    DISPLAYLEVEL(2, "\r%70s\r", "");   /* clean display line */
    DISPLAYLEVEL(2, "statistics ... \n");
    {   size_t const eSize = ZDICT_analyzeEntropy((char*)dictBuffer+hSize, dictBufferCapacity-hSize,
                                  compressionLevel,
                                  samplesBuffer, samplesSizes, nbSamples,
                                  (char*)dictBuffer + dictBufferCapacity - dictContentSize, dictContentSize,
                                  notificationLevel);
        if (ZDICT_isError(eSize)) return eSize;
        hSize += eSize;
    }

    /* add dictionary header (after entropy tables) */
    MEM_writeLE32(dictBuffer, ZSTD_MAGIC_DICTIONARY);
    {   U64 const randomID = XXH64((char*)dictBuffer + dictBufferCapacity - dictContentSize, dictContentSize, 0);
        U32 const compliantID = (randomID % ((1U<<31)-32768)) + 32768;
        U32 const dictID = params.dictID ? params.dictID : compliantID;
        MEM_writeLE32((char*)dictBuffer+4, dictID);
    }

    if (hSize + dictContentSize < dictBufferCapacity)
        memmove((char*)dictBuffer + hSize, (char*)dictBuffer + dictBufferCapacity - dictContentSize, dictContentSize);
    return MIN(dictBufferCapacity, hSize+dictContentSize);
}